

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

bool tinyusdz::anon_unknown_28::ComputeAbsPathAndAssignPrimIdRec
               (Stage *stage,Prim *prim,Path *parentPath,uint32_t depth,bool assign_prim_id,
               bool force_assign_prim_id,string *err)

{
  pointer pPVar1;
  bool bVar2;
  bool bVar3;
  Prim *child;
  pointer prim_00;
  uint64_t prim_id;
  Path abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  Path local_100;
  
  if (0x8000000 < depth) {
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  if ((prim->_elementPath)._prim_part._M_string_length == 0) {
    if (err == (string *)0x0) {
      return false;
    }
    Path::full_path_name_abi_cxx11_(&local_120,parentPath);
    std::operator+(&local_140,"Prim\'s elementName is empty. Prim\'s parent Path = ",&local_120);
    std::operator+(&local_100._prim_part,&local_140,"\n");
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return false;
  }
  Path::AppendPrim(&local_100,parentPath,&(prim->_elementPath)._prim_part);
  Path::operator=(&prim->_abs_path,&local_100);
  if ((assign_prim_id) && ((force_assign_prim_id || (prim->_prim_id < 1)))) {
    local_140._M_dataplus._M_p = (pointer)0x0;
    bVar2 = Stage::allocate_prim_id(stage,(uint64_t *)&local_140);
    if (!bVar2) {
      if (err != (string *)0x0) {
        std::__cxx11::string::append((char *)err);
      }
      bVar2 = false;
      goto LAB_001747de;
    }
    prim->_prim_id = (int64_t)local_140._M_dataplus._M_p;
  }
  prim_00 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar2 = prim_00 == pPVar1;
    if (bVar2) break;
    bVar3 = ComputeAbsPathAndAssignPrimIdRec
                      (stage,prim_00,&local_100,depth + 1,assign_prim_id,force_assign_prim_id,err);
    prim_00 = prim_00 + 1;
  } while (bVar3);
LAB_001747de:
  Path::~Path(&local_100);
  return bVar2;
}

Assistant:

bool ComputeAbsPathAndAssignPrimIdRec(const Stage &stage, Prim &prim,
                                      const Path &parentPath, uint32_t depth,
                                      bool assign_prim_id,
                                      bool force_assign_prim_id = true,
                                      std::string *err = nullptr) {
  if (depth > 1024 * 1024 * 128) {
    // too deep node.
    if (err) {
      (*err) += "Prim hierarchy too deep.\n";
    }
    return false;
  }

  if (prim.element_name().empty()) {
    // Prim's elementName must not be empty.
    if (err) {
      (*err) += "Prim's elementName is empty. Prim's parent Path = " +
                parentPath.full_path_name() + "\n";
    }
    return false;
  }

  Path abs_path = parentPath.AppendPrim(prim.element_name());

  prim.absolute_path() = abs_path;
  if (assign_prim_id) {
    if (force_assign_prim_id || (prim.prim_id() < 1)) {
      uint64_t prim_id{0};
      if (!stage.allocate_prim_id(&prim_id)) {
        if (err) {
          (*err) += "Failed to assign unique Prim ID.\n";
        }
        return false;
      }
      prim.prim_id() = int64_t(prim_id);
    }
  }

  for (Prim &child : prim.children()) {
    if (!ComputeAbsPathAndAssignPrimIdRec(stage, child, abs_path, depth + 1,
                                          assign_prim_id, force_assign_prim_id,
                                          err)) {
      return false;
    }
  }

  return true;
}